

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnElemSegment
          (SharedValidator *this,Location *loc,Var *table_var,SegmentKind kind)

{
  iterator __position;
  Result RVar1;
  Enum EVar2;
  ElemType local_64;
  Var local_60;
  
  EVar2 = Ok;
  if (kind == Active) {
    Var::Var(&local_60,table_var);
    RVar1 = CheckTableIndex(this,&local_60,(TableType *)0x0);
    EVar2 = (Enum)(RVar1.enum_ == Error);
    Var::~Var(&local_60);
  }
  local_64.element.enum_ = (Type)Void;
  __position._M_current =
       (this->elems_).
       super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->elems_).
      super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
    _M_realloc_insert<wabt::SharedValidator::ElemType>(&this->elems_,__position,&local_64);
  }
  else {
    ((__position._M_current)->element).enum_ = Void;
    (this->elems_).
    super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnElemSegment(const Location& loc,
                                      Var table_var,
                                      SegmentKind kind) {
  Result result = Result::Ok;
  if (kind == SegmentKind::Active) {
    result |= CheckTableIndex(table_var);
  }
  elems_.push_back(ElemType{Type::Void});  // Updated in OnElemSegmentElemType.
  return result;
}